

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_CheckSignature<Js::OpLayoutT_Reg1IntConst1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Reg1IntConst1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  BOOL BVar4;
  void *aValue;
  ScriptFunction *this_00;
  FunctionInfo *this_01;
  ScriptContext *pSVar5;
  FunctionBody *this_02;
  AsmJsFunctionInfo *this_03;
  WasmSignature *sig;
  AsmJsFunctionInfo *asmInfo;
  WasmSignature *expected;
  int sigIndex;
  ScriptFunction *func;
  OpLayoutT_Reg1IntConst1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  aValue = GetRegRawPtr<unsigned_short>(this,playout->R0);
  this_00 = VarTo<Js::ScriptFunction>(aValue);
  iVar1 = playout->C1;
  lVar2 = *(long *)(this + 0x140);
  this_01 = JavascriptFunction::GetFunctionInfo((JavascriptFunction *)this_00);
  BVar4 = FunctionInfo::IsDeferredParseFunction(this_01);
  if (BVar4 != 0) {
    pSVar5 = GetScriptContext(this);
    JavascriptError::ThrowWebAssemblyRuntimeError(pSVar5,-0x7ff5e49b,(PCWSTR)0x0);
  }
  this_02 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_00);
  this_03 = FunctionBody::GetAsmJsFunctionInfo(this_02);
  if (this_03 == (AsmJsFunctionInfo *)0x0) {
    pSVar5 = GetScriptContext(this);
    JavascriptError::ThrowWebAssemblyRuntimeError(pSVar5,-0x7ff5e49b,(PCWSTR)0x0);
  }
  sig = AsmJsFunctionInfo::GetWasmSignature(this_03);
  bVar3 = Wasm::WasmSignature::IsEquivalent<true>((WasmSignature *)(lVar2 + (long)iVar1 * 0x28),sig)
  ;
  if (!bVar3) {
    pSVar5 = GetScriptContext(this);
    JavascriptError::ThrowWebAssemblyRuntimeError(pSVar5,-0x7ff5e49a,(PCWSTR)0x0);
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_CheckSignature(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        ScriptFunction * func = VarTo<ScriptFunction>(GetRegRawPtr(playout->R0));
        int sigIndex = playout->C1;
        Wasm::WasmSignature * expected = &m_signatures[sigIndex];
        if (func->GetFunctionInfo()->IsDeferredParseFunction())
        {
            // TODO: should be able to assert this once imports are converted to wasm functions
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_NeedWebAssemblyFunc);
        }
        AsmJsFunctionInfo * asmInfo = func->GetFunctionBody()->GetAsmJsFunctionInfo();
        if (!asmInfo)
        {
            // TODO: should be able to assert this once imports are converted to wasm functions
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_NeedWebAssemblyFunc);
        }
        if (!expected->IsEquivalent(asmInfo->GetWasmSignature()))
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_SignatureMismatch);
        }
#endif
    }